

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

int getiovmax(void)

{
  long lVar1;
  
  if (getiovmax::iovmax != -1) {
    return getiovmax::iovmax;
  }
  lVar1 = sysconf(0x3c);
  getiovmax::iovmax = 1;
  if ((int)lVar1 != -1) {
    getiovmax::iovmax = (int)lVar1;
  }
  return getiovmax::iovmax;
}

Assistant:

int getiovmax()
{
	#if defined(IOV_MAX)
		return IOV_MAX;
	#elif defined(_SC_IOV_MAX)
		static int iovmax = -1;
		if (iovmax == -1) {
			iovmax = sysconf(_SC_IOV_MAX);
			/* On some embedded devices (arm-linux-uclibc based ip camera),
			* sysconf(_SC_IOV_MAX) can not get the correct value. The return
			* value is -1 and the errno is EINPROGRESS. Degrade the value to 1.
			*/
			if (iovmax == -1) iovmax = 1;
		}
		return iovmax;
	#elif defined(UIO_MAXIOV)
		return UIO_MAXIOV;
	#else
		return 1024;
	#endif
}